

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.h
# Opt level: O0

Worker * lace_steal(WorkerP *self,Task *__dq_head,Worker *victim)

{
  bool bVar1;
  undefined8 *puVar2;
  Task *t;
  TailSplitNA ts_new;
  TailSplitNA ts;
  Worker *victim_local;
  Task *__dq_head_local;
  WorkerP *self_local;
  
  if ((victim != (Worker *)0x0) && (victim->allstolen == '\0')) {
    ts = (TailSplitNA)victim;
    victim_local = (Worker *)__dq_head;
    __dq_head_local = (Task *)self;
    ts_new.v = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base *)&(victim->ts).ts)
    ;
    if (ts_new.ts.tail < ts_new.ts.split) {
      t = (Task *)CONCAT44(ts_new.ts.split,ts_new.ts.tail + 1);
      bVar1 = std::atomic_compare_exchange_weak<unsigned_long>
                        ((atomic<unsigned_long> *)(ts.v + 8),&ts_new.v,
                         (__atomic_val_t<unsigned_long>)t);
      if (!bVar1) {
        self_local = (WorkerP *)&DAT_00000001;
        return (Worker *)self_local;
      }
      puVar2 = (undefined8 *)(*(long *)ts + (ts_new.v & 0xffffffff) * 0x40);
      std::atomic_store_explicit<_Worker*>
                ((atomic<_Worker_*> *)(puVar2 + 1),
                 *(__atomic_val_t<_Worker_*> *)(__dq_head_local->d + 8),memory_order_relaxed);
      (*(code *)*puVar2)(__dq_head_local,victim_local,puVar2);
      std::atomic_store_explicit<_Worker*>
                ((atomic<_Worker_*> *)(puVar2 + 1),(__atomic_val_t<_Worker_*>)&DAT_00000002,
                 memory_order_release);
      return (Worker *)0x0;
    }
    if (*(char *)(ts.v + 0x40) == '\0') {
      *(undefined1 *)(ts.v + 0x40) = 1;
    }
  }
  self_local = (WorkerP *)&DAT_00000002;
  return (Worker *)self_local;
}

Assistant:

lace_steal(WorkerP *self, Task *__dq_head, Worker *victim)
{
    if (victim != NULL && !victim->allstolen) {
        TailSplitNA ts;
        ts.v = victim->ts.v;
        if (ts.ts.tail < ts.ts.split) {
            TailSplitNA ts_new;
            ts_new.v = ts.v;
            ts_new.ts.tail++;
            if (atomic_compare_exchange_weak(&victim->ts.v, &ts.v, ts_new.v)) {
                // Stolen
                Task *t = &victim->dq[ts.ts.tail];
                atomic_store_explicit(&t->thief, self->_public, memory_order_relaxed);
                lace_time_event(self, 1);
                t->f(self, __dq_head, t);
                lace_time_event(self, 2);
                atomic_store_explicit(&t->thief, THIEF_COMPLETED, memory_order_release);
                lace_time_event(self, 8);
                return LACE_STOLEN;
            }

            lace_time_event(self, 7);
            return LACE_BUSY;
        }

        if (victim->movesplit == 0) {
            victim->movesplit = 1;
            PR_COUNTSPLITS(self, CTR_split_req);
        }
    }

    lace_time_event(self, 7);
    return LACE_NOWORK;
}